

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::RABlock::prependSuccessor(RABlock *this,RABlock *successor)

{
  RABlocks *this_00;
  RABlocks *this_01;
  size_type *psVar1;
  uint uVar2;
  undefined8 *puVar3;
  Error EVar4;
  uint uVar5;
  ulong uVar6;
  RABlock *this_02;
  
  uVar5 = (this->_successors).super_ZoneVectorBase._size;
  if ((ulong)uVar5 != 0) {
    uVar6 = 0;
    do {
      if (*(RABlock **)((long)(this->_successors).super_ZoneVectorBase._data + uVar6 * 8) ==
          successor) {
        if (uVar6 != 0xffffffff) {
          return 0;
        }
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  uVar2 = (successor->_predecessors).super_ZoneVectorBase._size;
  if ((ulong)uVar2 != 0) {
    uVar6 = 0;
    do {
      if (*(RABlock **)((long)(successor->_predecessors).super_ZoneVectorBase._data + uVar6 * 8) ==
          this) {
        if (uVar6 != 0xffffffff) {
          prependSuccessor();
          this_02 = this;
          goto LAB_0011d65b;
        }
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  this_00 = &successor->_predecessors;
  this_02 = this;
  if ((successor->_predecessors).super_ZoneVectorBase._capacity == uVar2) {
    this_02 = (RABlock *)this_00;
    EVar4 = ZoneVectorBase::_grow(&this_00->super_ZoneVectorBase,&this->_ra->_allocator,8,1);
    if (EVar4 != 0) {
      return EVar4;
    }
    uVar5 = (this->_successors).super_ZoneVectorBase._size;
  }
  this_01 = &this->_successors;
  uVar2 = (this->_successors).super_ZoneVectorBase._capacity;
  if (uVar2 == uVar5) {
    this_02 = (RABlock *)this_01;
    EVar4 = ZoneVectorBase::_grow(&this_01->super_ZoneVectorBase,&this->_ra->_allocator,8,1);
    if (EVar4 != 0) {
      return EVar4;
    }
    uVar5 = (this->_successors).super_ZoneVectorBase._size;
    uVar2 = (this->_successors).super_ZoneVectorBase._capacity;
  }
  if (uVar5 < uVar2) {
    puVar3 = (undefined8 *)(this_01->super_ZoneVectorBase)._data;
    if (uVar5 != 0) {
      this_02 = (RABlock *)(puVar3 + 1);
      memmove(this_02,puVar3,(ulong)uVar5 << 3);
    }
    *puVar3 = successor;
    psVar1 = &(this->_successors).super_ZoneVectorBase._size;
    *psVar1 = *psVar1 + 1;
    uVar5 = (successor->_predecessors).super_ZoneVectorBase._size;
    if (uVar5 < (successor->_predecessors).super_ZoneVectorBase._capacity) {
      puVar3 = (undefined8 *)(this_00->super_ZoneVectorBase)._data;
      if ((ulong)uVar5 != 0) {
        memmove(puVar3 + 1,puVar3,(ulong)uVar5 << 3);
      }
      *puVar3 = this;
      psVar1 = &(successor->_predecessors).super_ZoneVectorBase._size;
      *psVar1 = *psVar1 + 1;
      return 0;
    }
  }
  else {
LAB_0011d65b:
    prependSuccessor();
  }
  prependSuccessor();
  FuncPass::FuncPass((FuncPass *)this_02,"BaseRAPass");
  ((ZoneVectorBase *)&this_02->_ra)->_data = &PTR__BaseRAPass_00154858;
  this_02->_last = (BaseNode *)0x0;
  ((ZoneBitVector *)&this_02->_firstPosition)->_data = (BitWord *)0x0;
  *(undefined8 *)&this_02->_weight = 0;
  *(undefined8 *)&(this_02->_regsStats)._packed = 0;
  *(undefined8 *)((this_02->_maxLiveCount).n + 1) = 0;
  ((ZoneBitVector *)((this_02->_maxLiveCount).n + 3))->_data = (BitWord *)0x0;
  this_02->_timestamp = 0;
  this_02->_idom = (RABlock *)0x0;
  (this_02->_predecessors).super_ZoneVectorBase._data = (void *)0x0;
  *(undefined8 *)&(this_02->_predecessors).super_ZoneVectorBase._size = 0;
  (this_02->_successors).super_ZoneVectorBase._data = (void *)0x0;
  *(PhysToWorkMap **)&(this_02->_successors).super_ZoneVectorBase._size = (PhysToWorkMap *)0x0;
  this_02->_liveBits[0]._data = (BitWord *)0x0;
  this_02->_liveBits[0]._size = 0;
  this_02->_liveBits[0]._capacity = 0;
  *(undefined8 *)&this_02->_liveBits[0]._capacity = 0;
  *(undefined8 *)((long)&this_02->_liveBits[1]._data + 4) = 0;
  this_02->_liveBits[2]._data = (BitWord *)0x0;
  this_02->_liveBits[2]._size = 0;
  this_02->_liveBits[2]._capacity = 0;
  this_02->_liveBits[3]._data = (BitWord *)0x0;
  this_02->_liveBits[3]._size = 0;
  this_02->_liveBits[3]._capacity = 0;
  this_02->_sharedAssignmentId = 0;
  this_02->_entryScratchGpRegs = 0;
  *(undefined8 *)&this_02->_exitScratchGpRegs = 0;
  this_02->_entryPhysToWorkMap = (PhysToWorkMap *)0x0;
  this_02->_entryWorkToPhysMap = (WorkToPhysMap *)0x0;
  this_02[1]._ra = (BaseRAPass *)0x0;
  this_02[1]._blockId = 0;
  this_02[1]._flags = 0;
  this_02[1]._first = (BaseNode *)0x0;
  this_02[1]._last = (BaseNode *)0x0;
  this_02[1]._firstPosition = 0;
  this_02[1]._endPosition = 0;
  this_02[1]._weight = 0;
  this_02[1]._povOrder = 0;
  *(undefined8 *)((long)&this_02[1]._povOrder + 2) = 0;
  *(undefined8 *)((long)this_02[1]._maxLiveCount.n + 2) = 0;
  *(undefined8 *)(this_02[1]._maxLiveCount.n + 3) = 0;
  this_02[1]._timestamp = 0;
  this_02[1]._idom = (RABlock *)0x0;
  this_02[1]._predecessors.super_ZoneVectorBase._data = (void *)0x0;
  this_02[1]._predecessors.super_ZoneVectorBase._size = 0;
  *(undefined4 *)&this_02[1]._entryPhysToWorkMap = 0;
  this_02[1]._sharedAssignmentId = 0;
  this_02[1]._entryScratchGpRegs = 0;
  *(undefined8 *)&this_02[1]._exitScratchGpRegs = 0;
  this_02[1]._liveBits[3]._data = (BitWord *)0x0;
  this_02[1]._liveBits[3]._size = 0;
  this_02[1]._liveBits[3]._capacity = 0;
  this_02[1]._liveBits[2]._data = (BitWord *)0x0;
  this_02[1]._liveBits[2]._size = 0;
  this_02[1]._liveBits[2]._capacity = 0;
  this_02[1]._liveBits[1]._data = (BitWord *)0x0;
  this_02[1]._liveBits[1]._size = 0;
  this_02[1]._liveBits[1]._capacity = 0;
  this_02[1]._liveBits[0]._data = (BitWord *)0x0;
  this_02[1]._liveBits[0]._size = 0;
  this_02[1]._liveBits[0]._capacity = 0;
  this_02[1]._successors.super_ZoneVectorBase._data = (void *)0x0;
  this_02[1]._successors.super_ZoneVectorBase._size = 0;
  this_02[1]._successors.super_ZoneVectorBase._capacity = 0;
  this_02[2]._last = (BaseNode *)0x0;
  this_02[2]._firstPosition = 0;
  this_02[2]._endPosition = 0;
  this_02[2]._blockId = 0;
  this_02[2]._flags = 0;
  this_02[2]._first = (BaseNode *)0x0;
  this_02[1]._entryWorkToPhysMap = (WorkToPhysMap *)0x0;
  this_02[2]._ra = (BaseRAPass *)0x0;
  this_02[2]._weight = 1;
  this_02[2]._povOrder = 0xff;
  *(undefined8 *)&this_02[2]._regsStats._packed = 0;
  this_02[2]._maxLiveCount.n[1] = 1;
  this_02[2]._maxLiveCount.n[2] = 0xff;
  this_02[2]._idom = (RABlock *)0x0;
  *(undefined8 *)(this_02[2]._maxLiveCount.n + 3) = 0;
  this_02[2]._timestamp = 0;
  *(undefined4 *)&this_02[2]._predecessors.super_ZoneVectorBase._data = 1;
  this_02[2]._successors.super_ZoneVectorBase._size = 0;
  this_02[2]._successors.super_ZoneVectorBase._capacity = 0;
  this_02[2]._predecessors.super_ZoneVectorBase._size = 0;
  this_02[2]._predecessors.super_ZoneVectorBase._capacity = 0;
  this_02[2]._successors.super_ZoneVectorBase._data = (void *)0x0;
  *(undefined1 *)&this_02[2]._liveBits[0]._data = 0xff;
  memset((void *)((long)&this_02[2]._liveBits[0]._data + 1),0,0x103);
  this_02[3]._liveBits[3]._data = (BitWord *)0x0;
  this_02[3]._liveBits[3]._size = 0;
  this_02[3]._liveBits[3]._capacity = 0;
  this_02[3]._sharedAssignmentId = 0;
  this_02[3]._entryScratchGpRegs = 0;
  *(undefined1 *)&this_02[3]._liveBits[3]._size = 0x20;
  *(undefined8 *)&this_02[3]._exitScratchGpRegs = 0x57;
  this_02[3]._entryPhysToWorkMap = (PhysToWorkMap *)&this_02[3]._entryWorkToPhysMap;
  *(undefined1 *)&this_02[3]._entryWorkToPhysMap = 0;
  return (Error)&this_02[3]._entryWorkToPhysMap;
}

Assistant:

Error RABlock::prependSuccessor(RABlock* successor) noexcept {
  RABlock* predecessor = this;

  if (predecessor->_successors.contains(successor))
    return kErrorOk;
  ASMJIT_ASSERT(!successor->_predecessors.contains(predecessor));

  ASMJIT_PROPAGATE(successor->_predecessors.willGrow(allocator()));
  ASMJIT_PROPAGATE(predecessor->_successors.willGrow(allocator()));

  predecessor->_successors.prependUnsafe(successor);
  successor->_predecessors.prependUnsafe(predecessor);

  return kErrorOk;
}